

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.h
# Opt level: O2

BufferWithRandomAccess * __thiscall
wasm::BufferWithRandomAccess::operator<<(BufferWithRandomAccess *this,S32LEB x)

{
  bool bVar1;
  ostream *poVar2;
  byte *pbVar3;
  size_t in_RCX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  size_t i;
  ulong __n;
  LEB<int,_signed_char> local_34 [2];
  S32LEB x_local;
  
  bVar1 = isDebugEnabled("binary");
  if (bVar1) {
    __n = (long)(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
    poVar2 = std::operator<<((ostream *)&std::cerr,"writeS32LEB: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,x.value);
    poVar2 = std::operator<<(poVar2," (at ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,")");
    std::endl<char,std::char_traits<char>>(poVar2);
    __buf = extraout_RDX_00;
  }
  else {
    __n = 0xffffffffffffffff;
    __buf = extraout_RDX;
  }
  LEB<int,_signed_char>::write(local_34,(int)this,__buf,in_RCX);
  bVar1 = isDebugEnabled("binary");
  if (bVar1) {
    for (; __n < (ulong)((long)(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start); __n = __n + 1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"  ");
      pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,__n);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)*pbVar3);
      poVar2 = std::operator<<(poVar2," (at ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::operator<<(poVar2,")\n");
    }
  }
  return this;
}

Assistant:

BufferWithRandomAccess& operator<<(S32LEB x) {
    [[maybe_unused]] size_t before = -1;
    BYN_DEBUG(before = size(); std::cerr << "writeS32LEB: " << x.value
                                         << " (at " << before << ")"
                                         << std::endl;);
    x.write(this);
    BYN_DEBUG(for (size_t i = before; i < size(); i++) {
      std::cerr << "  " << (int)at(i) << " (at " << i << ")\n";
    });
    return *this;
  }